

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

void __thiscall Process::runProcess(Process *this)

{
  double dVar1;
  int iVar2;
  ostream *poVar3;
  Process *this_00;
  long lVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<int,_std::allocator<int>_> distribution;
  uint local_7c;
  double local_78;
  double local_70;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_7c = 0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dVar1 = (double)this->t;
  local_78 = this->tau;
  lVar4 = 0;
  do {
    this_00 = this;
    local_70 = dVar1;
    (**this->_vptr_Process)(this,(ulong)local_7c);
    iVar2 = yesOrNo(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (iVar2 == 0) {
      local_78 = local_78 + this->tau;
    }
    else {
      local_7c = local_7c + 1;
      local_78 = this->tau;
    }
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_68,(value_type_conflict *)&local_7c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::operator<<((ostream *)&std::cout," t = ");
    poVar3 = std::ostream::_M_insert<double>(local_70);
    poVar3 = std::operator<<(poVar3,"    f(t) = ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(int *)((long)local_68._M_impl.super__Vector_impl_data._M_start +
                                       lVar4));
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout,anon_var_dwarf_89c5);
    poVar3 = std::ostream::_M_insert<double>(local_78);
    poVar3 = std::operator<<(poVar3,anon_var_dwarf_89de);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    dVar1 = local_70 + this->tau;
    lVar4 = lVar4 + 4;
  } while (dVar1 < (double)this->T);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,
             (vector<int,_std::allocator<int>_> *)&local_68);
  fileOutPut(this,(vector<int,_std::allocator<int>_> *)&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void Process::runProcess() {
        std::vector <int> distribution;
        int k = 0;
        int i = 0;
        double t0 = t;
        double deltaT = tau;
            do{
                if (yesOrNo(probabilityPoisson(k, t0)) != 0){
                        k+=1;
                        deltaT = tau;
                    }
                else{
                    k+=0;
                    deltaT+=tau;
                }
                distribution.push_back(k);
                std::cout << std::endl;
                std::cout << " t = " << t0 << "    f(t) = " << distribution[i] << std::endl;
                std::cout << " Время без успеха: " << deltaT << " секунд" << std::endl;
                std::cout << std::endl;
                i++;
                t0+=tau;
              } while(t0 < T);
            fileOutPut(distribution);
}